

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_expression_assertion.hpp
# Opt level: O0

ExpressionResult * __thiscall
iutest::detail::ExpressionLHS<int>::operator==
          (ExpressionResult *__return_storage_ptr__,ExpressionLHS<int> *this,int *rhs)

{
  AssertionResult *pAVar1;
  AssertionResult local_50;
  undefined1 local_21;
  int *piStack_20;
  bool b;
  int *rhs_local;
  ExpressionLHS<int> *this_local;
  
  local_21 = this->m_lhs == *rhs;
  piStack_20 = rhs;
  rhs_local = &this->m_lhs;
  this_local = (ExpressionLHS<int> *)__return_storage_ptr__;
  AssertionResult::AssertionResult(&local_50,(bool)local_21);
  pAVar1 = AssertionResult::operator<<(&local_50,&this->m_message);
  pAVar1 = AssertionResult::operator<<(pAVar1,(char (*) [5])" == ");
  pAVar1 = AssertionResult::operator<<(pAVar1,piStack_20);
  ExpressionResult::ExpressionResult(__return_storage_ptr__,pAVar1);
  AssertionResult::~AssertionResult(&local_50);
  return __return_storage_ptr__;
}

Assistant:

IIUT_DECL_EXPRESSION_OP(==)
    IIUT_DECL_EXPRESSION_OP(!=)
    IIUT_DECL_EXPRESSION_OP(<)
    IIUT_DECL_EXPRESSION_OP(<=)
    IIUT_DECL_EXPRESSION_OP(>)
    IIUT_DECL_EXPRESSION_OP(>=)
    IIUT_DECL_EXPRESSION_OP(&&)
    IIUT_DECL_EXPRESSION_OP(||)

#if IUTEST_HAS_ARITHMETIC_EXPRESSION_DECOMPOSE
    IIUT_DECL_EXPRESSION_OP_LHS(+)
    IIUT_DECL_EXPRESSION_OP_LHS(-)
    IIUT_DECL_EXPRESSION_OP_LHS(*)
    IIUT_DECL_EXPRESSION_OP_LHS(/)
    IIUT_DECL_EXPRESSION_OP_LHS(%)
#endif

#if IUTEST_HAS_BITWISE_EXPRESSION_DECOMPOSE
    IIUT_DECL_EXPRESSION_OP_LHS(&)
    IIUT_DECL_EXPRESSION_OP_LHS(|)
    IIUT_DECL_EXPRESSION_OP_LHS(^)
    IIUT_DECL_EXPRESSION_OP_LHS(<<)
    IIUT_DECL_EXPRESSION_OP_LHS(>>)
#endif

private:
    template<typename U>
    ExpressionLHS<U> OperandResult(const U& lhs) const
    {
        return ExpressionLHS<U>(lhs, m_message);
    }